

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O1

size_t ans_byte_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  uint8_t *out_u8;
  ans_byte_encode ans_frame;
  long *local_1278 [2];
  void *local_1268;
  ans_byte_encode local_1240;
  
  ans_byte_encode::create(&local_1240,(uint8_t *)src,srcSize);
  local_1278[0] = (long *)dst;
  local_1268 = dst;
  ans_byte_encode::serialize(&local_1240,(uint8_t **)local_1278);
  uVar9 = local_1240.lower_bound;
  if ((srcSize & 3) == 0) {
    lVar10 = 0;
  }
  else {
    lVar10 = 0;
    plVar12 = local_1278[0];
    do {
      bVar1 = *(byte *)((long)src + lVar10 + (srcSize - 1));
      if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar9) {
        *(int *)plVar12 = (int)uVar9;
        plVar12 = (long *)((long)plVar12 + 4);
        uVar9 = uVar9 >> 0x20;
        local_1278[0] = plVar12;
      }
      uVar2 = local_1240.table._M_elems[bVar1].freq;
      uVar9 = (ulong)local_1240.table._M_elems[bVar1].base + uVar9 % (ulong)uVar2 +
              (uVar9 / uVar2) * local_1240.frame_size;
      lVar10 = lVar10 + -1;
    } while (-lVar10 != (ulong)((uint)srcSize & 3));
    lVar10 = -lVar10;
  }
  plVar12 = local_1278[0];
  uVar14 = local_1240.lower_bound;
  uVar11 = local_1240.lower_bound;
  uVar13 = local_1240.lower_bound;
  for (lVar10 = srcSize - lVar10; lVar10 != 0; lVar10 = lVar10 + -4) {
    bVar1 = *(byte *)((long)src + lVar10 + -1);
    if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar9) {
      *(int *)plVar12 = (int)uVar9;
      plVar12 = (long *)((long)plVar12 + 4);
      uVar9 = uVar9 >> 0x20;
      local_1278[0] = plVar12;
    }
    uVar2 = local_1240.table._M_elems[bVar1].freq;
    uVar3 = local_1240.table._M_elems[bVar1].base;
    bVar1 = *(byte *)((long)src + lVar10 + -2);
    if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar14) {
      *(int *)plVar12 = (int)uVar14;
      plVar12 = (long *)((long)plVar12 + 4);
      uVar14 = uVar14 >> 0x20;
      local_1278[0] = plVar12;
    }
    uVar4 = local_1240.table._M_elems[bVar1].freq;
    uVar5 = local_1240.table._M_elems[bVar1].base;
    bVar1 = *(byte *)((long)src + lVar10 + -3);
    if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar11) {
      *(int *)plVar12 = (int)uVar11;
      plVar12 = (long *)((long)plVar12 + 4);
      uVar11 = uVar11 >> 0x20;
      local_1278[0] = plVar12;
    }
    uVar6 = local_1240.table._M_elems[bVar1].freq;
    uVar7 = local_1240.table._M_elems[bVar1].base;
    bVar1 = *(byte *)((long)src + lVar10 + -4);
    if (local_1240.table._M_elems[bVar1].sym_upper_bound <= uVar13) {
      *(int *)plVar12 = (int)uVar13;
      plVar12 = (long *)((long)plVar12 + 4);
      uVar13 = uVar13 >> 0x20;
      local_1278[0] = plVar12;
    }
    uVar8 = local_1240.table._M_elems[bVar1].freq;
    uVar9 = uVar9 % (ulong)uVar2 + (ulong)uVar3 + (uVar9 / uVar2) * local_1240.frame_size;
    uVar14 = uVar14 % (ulong)uVar4 + (ulong)uVar5 + (uVar14 / uVar4) * local_1240.frame_size;
    uVar11 = uVar11 % (ulong)uVar6 + (ulong)uVar7 + (uVar11 / uVar6) * local_1240.frame_size;
    uVar13 = (ulong)local_1240.table._M_elems[bVar1].base + uVar13 % (ulong)uVar8 +
             (uVar13 / uVar8) * local_1240.frame_size;
  }
  *local_1278[0] = uVar9 - local_1240.lower_bound;
  local_1278[0][1] = uVar14 - local_1240.lower_bound;
  local_1278[0][2] = uVar11 - local_1240.lower_bound;
  local_1278[0][3] = uVar13 - local_1240.lower_bound;
  return (long)local_1278[0] + (0x20 - (long)local_1268);
}

Assistant:

size_t ans_byte_compress(
    void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(src);
    auto ans_frame = ans_byte_encode::create(in_u8, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    uint64_t state_a = ans_frame.initial_state();
    uint64_t state_b = ans_frame.initial_state();
    uint64_t state_c = ans_frame.initial_state();
    uint64_t state_d = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(state_b, in_u8[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(state_c, in_u8[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(state_d, in_u8[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(state_a, out_u8);
    ans_frame.flush_state(state_b, out_u8);
    ans_frame.flush_state(state_c, out_u8);
    ans_frame.flush_state(state_d, out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}